

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void convert_32s6u_C1R(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  OPJ_INT32 OVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  
  pbVar5 = pDst + 2;
  for (uVar2 = 0; uVar2 < (length & 0xfffffffffffffffc); uVar2 = uVar2 + 4) {
    uVar3 = pSrc[uVar2 + 1];
    uVar6 = pSrc[uVar2 + 2];
    OVar1 = pSrc[uVar2 + 3];
    pbVar5[-2] = (byte)(uVar3 >> 4) | (byte)(pSrc[uVar2] << 2);
    pbVar5[-1] = (byte)(uVar6 >> 2) | (byte)(uVar3 << 4);
    *pbVar5 = (byte)(uVar6 << 6) | (byte)OVar1;
    pbVar5 = pbVar5 + 3;
  }
  if ((length & 3) != 0) {
    uVar3 = 0;
    iVar4 = (int)(length & 3);
    if (iVar4 == 1) {
      uVar6 = 0;
      uVar3 = 0;
    }
    else {
      uVar6 = pSrc[uVar2 + 1];
      if (iVar4 == 3) {
        uVar3 = pSrc[uVar2 + 2];
      }
    }
    pbVar5[-2] = (byte)(uVar6 >> 4) | (byte)(pSrc[uVar2] << 2);
    if ((iVar4 != 1) && (pbVar5[-1] = (byte)(uVar3 >> 2) | (byte)(uVar6 << 4), iVar4 == 3)) {
      *pbVar5 = (char)uVar3 << 6;
    }
  }
  return;
}

Assistant:

static void convert_32s6u_C1R(const OPJ_INT32* pSrc, OPJ_BYTE* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i+=4U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i+1];
		OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i+2];
		OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i+3];
		
		*pDst++ = (OPJ_BYTE)((src0 << 2) | (src1 >> 4));
		*pDst++ = (OPJ_BYTE)(((src1 & 0xFU) << 4) | (src2 >> 2));
		*pDst++ = (OPJ_BYTE)(((src2 & 0x3U) << 6) | src3);
	}
	
	if (length & 3U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = 0U;
		OPJ_UINT32 src2 = 0U;
		length = length & 3U;
		
		if (length > 1U) {
			src1 = (OPJ_UINT32)pSrc[i+1];
			if (length > 2U) {
				src2 = (OPJ_UINT32)pSrc[i+2];
			}
		}
		*pDst++ = (OPJ_BYTE)((src0 << 2) | (src1 >> 4));
		if (length > 1U) {
			*pDst++ = (OPJ_BYTE)(((src1 & 0xFU) << 4) | (src2 >> 2));
			if (length > 2U) {
				*pDst++ = (OPJ_BYTE)(((src2 & 0x3U) << 6));
			}
		}
	}
}